

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O3

void * Abc_NodeGetCuts(void *p,Abc_Obj_t *pObj,int fDag,int fTree)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  int *piVar4;
  Cut_Params_t *pCVar5;
  Vec_Int_t *pVVar6;
  Cut_Cut_t *pCVar7;
  int Node1;
  void **ppvVar8;
  uint uVar9;
  int Node;
  ulong uVar10;
  uint uVar11;
  byte bVar12;
  bool bVar13;
  
  if ((pObj->vFanins).nSize != 2) {
    __assert_fail("Abc_ObjFaninNum(pObj) == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCut.c"
                  ,0x1b6,"void *Abc_NodeGetCuts(void *, Abc_Obj_t *, int, int)");
  }
  uVar11 = 0;
  bVar12 = 0;
  if (1 < (pObj->vFanouts).nSize) {
    iVar3 = Abc_NodeIsMuxControlType(pObj);
    if (iVar3 == 0) {
      Cut_ManIncrementDagNodes((Cut_Man_t *)p);
      bVar12 = 1;
    }
    else {
      bVar12 = 0;
    }
  }
  if (fTree != 0) {
    piVar4 = (pObj->vFanins).pArray;
    ppvVar8 = pObj->pNtk->vObjs->pArray;
    uVar11 = 0;
    uVar9 = 0;
    if (1 < (((Abc_Obj_t *)ppvVar8[*piVar4])->vFanouts).nSize) {
      iVar3 = Abc_NodeIsMuxControlType((Abc_Obj_t *)ppvVar8[*piVar4]);
      uVar9 = (uint)(iVar3 == 0);
      piVar4 = (pObj->vFanins).pArray;
      ppvVar8 = pObj->pNtk->vObjs->pArray;
    }
    if (1 < (((Abc_Obj_t *)ppvVar8[piVar4[1]])->vFanouts).nSize) {
      iVar3 = Abc_NodeIsMuxControlType((Abc_Obj_t *)ppvVar8[piVar4[1]]);
      uVar11 = (uint)(iVar3 == 0) * 2;
    }
    uVar11 = uVar11 | uVar9;
  }
  pCVar5 = Cut_ManReadParams((Cut_Man_t *)p);
  if (pCVar5->fLocal != 0) {
    pVVar6 = Cut_ManReadNodeAttrs((Cut_Man_t *)p);
    uVar10 = (ulong)pObj->Id;
    if ((-1 < (long)uVar10) && (pObj->Id < pVVar6->nSize)) {
      if (pVVar6->pArray[uVar10] != 0) {
        Cut_ManIncrementDagNodes((Cut_Man_t *)p);
        uVar10 = (ulong)(uint)pObj->Id;
        if (pObj->Id < 0) goto LAB_002a4913;
      }
      uVar11 = pVVar6->nSize;
      Node = (int)uVar10;
      if (Node < (int)uVar11) {
        piVar4 = pVVar6->pArray;
        bVar13 = piVar4[uVar10 & 0xffffffff] == 0;
        piVar2 = (pObj->vFanins).pArray;
        iVar3 = *piVar2;
        ppvVar8 = pObj->pNtk->vObjs->pArray;
        uVar9 = *(uint *)((long)ppvVar8[iVar3] + 0x10);
        if ((-1 < (long)(int)uVar9) && (uVar9 < uVar11)) {
          Node1 = piVar2[1];
          uVar1 = *(uint *)((long)ppvVar8[Node1] + 0x10);
          if ((-1 < (long)(int)uVar1) && (uVar1 < uVar11)) {
            uVar11 = piVar4[(int)uVar1] * 2 | piVar4[(int)uVar9];
            goto LAB_002a48de;
          }
        }
      }
    }
LAB_002a4913:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  bVar13 = (bool)(fDag == 0 | bVar12);
  Node = pObj->Id;
  piVar4 = (pObj->vFanins).pArray;
  iVar3 = *piVar4;
  Node1 = piVar4[1];
LAB_002a48de:
  pCVar7 = Cut_NodeComputeCuts((Cut_Man_t *)p,Node,iVar3,Node1,*(uint *)&pObj->field_0x14 >> 10 & 1,
                               *(uint *)&pObj->field_0x14 >> 0xb & 1,(uint)bVar13,uVar11);
  return pCVar7;
}

Assistant:

void * Abc_NodeGetCuts( void * p, Abc_Obj_t * pObj, int fDag, int fTree )
{
    Abc_Obj_t * pFanin;
    int fDagNode, fTriv, TreeCode = 0;
//    assert( Abc_NtkIsStrash(pObj->pNtk) );
    assert( Abc_ObjFaninNum(pObj) == 2 );

    // check if the node is a DAG node
    fDagNode = (Abc_ObjFanoutNum(pObj) > 1 && !Abc_NodeIsMuxControlType(pObj));
    // increment the counter of DAG nodes
    if ( fDagNode ) Cut_ManIncrementDagNodes( (Cut_Man_t *)p );
    // add the trivial cut if the node is a DAG node, or if we compute all cuts
    fTriv = fDagNode || !fDag;
    // check if fanins are DAG nodes
    if ( fTree )
    {
        pFanin = Abc_ObjFanin0(pObj);
        TreeCode |=  (Abc_ObjFanoutNum(pFanin) > 1 && !Abc_NodeIsMuxControlType(pFanin));
        pFanin = Abc_ObjFanin1(pObj);
        TreeCode |= ((Abc_ObjFanoutNum(pFanin) > 1 && !Abc_NodeIsMuxControlType(pFanin)) << 1);
    }

    // changes due to the global/local cut computation
    {
        Cut_Params_t * pParams = Cut_ManReadParams((Cut_Man_t *)p);
        if ( pParams->fLocal )
        {
            Vec_Int_t * vNodeAttrs = Cut_ManReadNodeAttrs((Cut_Man_t *)p);
            fDagNode = Vec_IntEntry( vNodeAttrs, pObj->Id );
            if ( fDagNode ) Cut_ManIncrementDagNodes( (Cut_Man_t *)p );
//            fTriv = fDagNode || !pParams->fGlobal;
            fTriv = !Vec_IntEntry( vNodeAttrs, pObj->Id );
            TreeCode = 0;
            pFanin = Abc_ObjFanin0(pObj);
            TreeCode |=  Vec_IntEntry( vNodeAttrs, pFanin->Id );
            pFanin = Abc_ObjFanin1(pObj);
            TreeCode |= (Vec_IntEntry( vNodeAttrs, pFanin->Id ) << 1);
        }
    }
    return Cut_NodeComputeCuts( (Cut_Man_t *)p, pObj->Id, Abc_ObjFaninId0(pObj), Abc_ObjFaninId1(pObj),  
        Abc_ObjFaninC0(pObj), Abc_ObjFaninC1(pObj), fTriv, TreeCode );  
}